

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::addGroupFilter(CommandLineArguments *this,int ac,char **av,int *i)

{
  TestFilter *pTVar1;
  undefined4 in_ESI;
  SimpleString *in_RDI;
  TestFilter *groupFilter;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  SimpleString *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  char **in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  CommandLineArguments *in_stack_ffffffffffffffd8;
  
  pTVar1 = (TestFilter *)operator_new((size_t)in_RDI,in_stack_ffffffffffffff78,0);
  SimpleString::SimpleString(in_RDI,in_stack_ffffffffffffff78);
  getParameterField(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  TestFilter::TestFilter((TestFilter *)CONCAT44(in_ESI,in_stack_ffffffffffffff90),&pTVar1->filter_);
  SimpleString::~SimpleString((SimpleString *)0x123dcd);
  SimpleString::~SimpleString((SimpleString *)0x123dd7);
  pTVar1 = TestFilter::add(pTVar1,(TestFilter *)in_RDI[3].bufferSize_);
  in_RDI[3].bufferSize_ = (size_t)pTVar1;
  return;
}

Assistant:

void CommandLineArguments::addGroupFilter(int ac, const char *const *av, int& i)
{
    TestFilter* groupFilter = new TestFilter(getParameterField(ac, av, i, "-g"));
    groupFilters_ = groupFilter->add(groupFilters_);
}